

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O1

void pfd_receive(Plug *plug,int urgent,char *data,size_t len)

{
  BinarySink *pBVar1;
  char cVar2;
  SshChannel *pSVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  undefined4 uVar7;
  uint uVar8;
  uint8_t *p;
  char *s;
  unsigned_long uVar9;
  PlugVtable *pPVar10;
  ushort *puVar11;
  strbuf *psVar12;
  BinarySourceError BVar13;
  ulong uVar14;
  uint uVar15;
  uchar val;
  bool bVar16;
  ptrlen pVar17;
  BinarySource src [1];
  
  if (len == 0) {
    return;
  }
  if (*(int *)((long)&plug[-5].vt + 4) != 0) {
    BinarySink_put_data((BinarySink *)&(plug[-2].vt)->sent,data,len);
    if (*(int *)((long)&plug[-5].vt + 4) == 1) {
      cVar2 = (char)*(plug[-2].vt)->closing;
      if (cVar2 == '\x04') {
        uVar7 = 2;
      }
      else {
        if (cVar2 != '\x05') {
LAB_00106467:
          (**(code **)((plug[-6].vt)->log + 8))();
          free_portfwd_state((PortForwarding *)(plug + -8));
          return;
        }
        uVar7 = 3;
      }
      *(undefined4 *)((long)&plug[-5].vt + 4) = uVar7;
    }
    src[0].data = (plug[-2].vt)->closing;
    src[0].len = (size_t)(plug[-2].vt)->receive;
    src[0].pos = 0;
    src[0].err = BSE_NO_ERROR;
    src[0].binarysource_ = src;
    BinarySource_get_data(src,(size_t)plug[-1].vt);
switchD_00105ff5_default:
    switch(*(undefined4 *)((long)&plug[-5].vt + 4)) {
    case 0:
      goto switchD_00105ff5_caseD_0;
    case 1:
      __assert_fail("false && \"These case values cannot appear\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c"
                    ,0xf5,"void pfd_receive(Plug *, int, const char *, size_t)");
    case 2:
      uVar4 = BinarySource_get_byte(src[0].binarysource_);
      uVar5 = BinarySource_get_byte(src[0].binarysource_);
      if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
        return;
      }
      if ((uVar4 == '\x04') && (uVar5 == '\x01')) {
        uVar8 = BinarySource_get_uint16(src[0].binarysource_);
        uVar9 = BinarySource_get_uint32(src[0].binarysource_);
        uVar15 = (uint)uVar9 - 1;
        BinarySource_get_asciz(src[0].binarysource_);
        if (uVar15 < 0xff) {
          s = BinarySource_get_asciz(src[0].binarysource_);
        }
        else {
          s = (char *)0x0;
        }
        BVar13 = (src[0].binarysource_)->err;
        if (BVar13 == BSE_NO_ERROR) {
          *(uint *)&plug[-3].vt = uVar8;
          if (uVar15 < 0xff) {
            pPVar10 = (PlugVtable *)dupstr(s);
          }
          else {
            pPVar10 = (PlugVtable *)
                      dupprintf("%u.%u.%u.%u",uVar9 >> 0x18 & 0xff,
                                (ulong)((uint)(uVar9 >> 0x10) & 0xff),
                                (ulong)((uint)(uVar9 >> 8) & 0xff),(ulong)((uint)uVar9 & 0xff));
          }
          plug[-4].vt = pPVar10;
          psVar12 = strbuf_new();
          pBVar1 = psVar12->binarysink_;
          BinarySink_put_byte(pBVar1,'\0');
          BinarySink_put_byte(pBVar1,'Z');
          BinarySink_put_uint16(pBVar1,0);
          BinarySink_put_uint32(pBVar1,0);
          (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar12->u,psVar12->len);
          strbuf_free(psVar12);
          *(undefined4 *)((long)&plug[-5].vt + 4) = 0;
          plug[-1].vt = (PlugVtable *)src[0].pos;
          BVar13 = 5;
        }
        else if (BVar13 != BSE_OUT_OF_DATA) {
          BVar13 = 6;
        }
        if (BVar13 == 5) goto switchD_00105ff5_default;
        if (BVar13 != 6) {
          return;
        }
      }
      psVar12 = strbuf_new();
      pBVar1 = psVar12->binarysink_;
      BinarySink_put_byte(pBVar1,'\0');
      BinarySink_put_byte(pBVar1,'[');
      BinarySink_put_uint16(pBVar1,0);
      BinarySink_put_uint32(pBVar1,0);
      (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar12->u,psVar12->len);
      strbuf_free(psVar12);
      goto LAB_00106467;
    case 3:
      BinarySource_get_byte(src[0].binarysource_);
      pVar17 = BinarySource_get_pstring(src[0].binarysource_);
      uVar4 = 0xff;
      if (pVar17.len != 0) {
        uVar14 = 1;
        do {
          if (*(char *)((long)pVar17.ptr + (uVar14 - 1)) == '\0') {
            uVar4 = '\0';
            break;
          }
          bVar16 = uVar14 < pVar17.len;
          uVar14 = uVar14 + 1;
        } while (bVar16);
      }
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
          return;
        }
        uVar4 = 0xff;
      }
      psVar12 = strbuf_new();
      BinarySink_put_byte(psVar12->binarysink_,'\x05');
      BinarySink_put_byte(psVar12->binarysink_,uVar4);
      (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar12->u,psVar12->len);
      strbuf_free(psVar12);
      uVar7 = 4;
      if (uVar4 == 0xff) goto LAB_00106467;
      break;
    case 4:
      uVar4 = BinarySource_get_byte(src[0].binarysource_);
      uVar5 = BinarySource_get_byte(src[0].binarysource_);
      uVar6 = BinarySource_get_byte(src[0].binarysource_);
      val = '\a';
      if (((uVar4 == '\x05') && (uVar5 == '\x01')) && (uVar6 == '\0')) {
        uVar4 = BinarySource_get_byte(src[0].binarysource_);
        if (uVar4 == '\x04') {
          pVar17 = BinarySource_get_data(src[0].binarysource_,0x10);
          puVar11 = (ushort *)pVar17.ptr;
          if (pVar17.len != 0x10) {
            __assert_fail("ipv6.len == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c"
                          ,0xb6,"char *ipv6_to_string(ptrlen)");
          }
          pPVar10 = (PlugVtable *)
                    dupprintf("%04x:%04x:%04x:%04x:%04x:%04x:%04x:%04x",
                              (ulong)(ushort)(*puVar11 << 8 | *puVar11 >> 8),
                              (ulong)(ushort)(puVar11[1] << 8 | puVar11[1] >> 8),
                              (ulong)(ushort)(puVar11[2] << 8 | puVar11[2] >> 8),
                              (ulong)(ushort)(puVar11[3] << 8 | puVar11[3] >> 8),
                              (ulong)(ushort)(puVar11[4] << 8 | puVar11[4] >> 8),
                              (ulong)(ushort)(puVar11[5] << 8 | puVar11[5] >> 8),
                              (ulong)(ushort)(puVar11[6] << 8 | puVar11[6] >> 8),
                              (ulong)(ushort)(puVar11[7] << 8 | puVar11[7] >> 8));
LAB_00106351:
          val = '\0';
          plug[-4].vt = pPVar10;
        }
        else if (uVar4 == '\x03') {
          pVar17 = BinarySource_get_pstring(src[0].binarysource_);
          pPVar10 = (PlugVtable *)mkstr(pVar17);
          plug[-4].vt = pPVar10;
          val = '\0';
        }
        else {
          if (uVar4 == '\x01') {
            uVar9 = BinarySource_get_uint32(src[0].binarysource_);
            pPVar10 = (PlugVtable *)
                      dupprintf("%u.%u.%u.%u",uVar9 >> 0x18 & 0xff,
                                (ulong)((uint)(uVar9 >> 0x10) & 0xff),
                                (ulong)((uint)(uVar9 >> 8) & 0xff),(ulong)((uint)uVar9 & 0xff));
            goto LAB_00106351;
          }
          plug[-4].vt = (PlugVtable *)0x0;
          val = '\b';
        }
        uVar8 = BinarySource_get_uint16(src[0].binarysource_);
        *(uint *)&plug[-3].vt = uVar8;
      }
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
          return;
        }
        val = '\x01';
      }
      psVar12 = strbuf_new();
      pBVar1 = psVar12->binarysink_;
      BinarySink_put_byte(pBVar1,'\x05');
      BinarySink_put_byte(pBVar1,val);
      uVar7 = 0;
      BinarySink_put_byte(pBVar1,'\0');
      BinarySink_put_byte(pBVar1,'\x01');
      BinarySink_put_uint32(pBVar1,0);
      BinarySink_put_uint16(pBVar1,0);
      (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar12->u,psVar12->len);
      strbuf_free(psVar12);
      if (val != '\0') goto LAB_00106467;
      break;
    default:
      goto switchD_00105ff5_default;
    }
    *(undefined4 *)((long)&plug[-5].vt + 4) = uVar7;
    plug[-1].vt = (PlugVtable *)src[0].pos;
    goto switchD_00105ff5_default;
  }
LAB_001064b8:
  if (*(char *)((long)&plug[-5].vt + 1) == '\x01') {
    pSVar3 = ((PortForwarding *)(plug + -8))->c;
    (*pSVar3->vt->write)(pSVar3,false,data,len);
  }
  return;
switchD_00105ff5_caseD_0:
  (**(code **)((plug[-6].vt)->log + 0x28))(plug[-6].vt,1);
  pPVar10 = (PlugVtable *)
            wrap_lportfwd_open((ConnectionLayer *)plug[-7].vt,(char *)plug[-4].vt,
                               *(int *)&plug[-3].vt,(Socket *)plug[-6].vt,(Channel *)(plug + 1));
  plug[-8].vt = pPVar10;
  goto LAB_001064b8;
}

Assistant:

static void pfd_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    struct PortForwarding *pf =
        container_of(plug, struct PortForwarding, plug);

    if (len == 0)
        return;

    if (pf->socks_state != SOCKS_NONE) {
        BinarySource src[1];

        /*
         * Store all the data we've got in socksbuf.
         */
        put_data(pf->socksbuf, data, len);

        /*
         * Check the start of socksbuf to see if it's a valid and
         * complete message in the SOCKS exchange.
         */

        if (pf->socks_state == SOCKS_INITIAL) {
            /* Preliminary: check the first byte of the data (which we
             * _must_ have by now) to find out which SOCKS major
             * version we're speaking. */
            switch (pf->socksbuf->u[0]) {
              case SOCKS4_REQUEST_VERSION:
                pf->socks_state = SOCKS_4;
                break;
              case SOCKS5_REQUEST_VERSION:
                pf->socks_state = SOCKS_5_INITIAL;
                break;
              default:
                pfd_close(pf);         /* unrecognised version */
                return;
            }
        }

        BinarySource_BARE_INIT(src, pf->socksbuf->u, pf->socksbuf->len);
        get_data(src, pf->socksbuf_consumed);

        while (pf->socks_state != SOCKS_NONE) {
            unsigned socks_version, message_type, reserved_byte;
            unsigned reply_code, port, ipv4, method;
            ptrlen methods;
            const char *socks4_hostname;
            strbuf *output;

            switch (pf->socks_state) {
              case SOCKS_INITIAL:
              case SOCKS_NONE:
                unreachable("These case values cannot appear");

              case SOCKS_4:
                /* SOCKS 4/4A connect message */
                socks_version = get_byte(src);
                message_type = get_byte(src);

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (socks_version == SOCKS4_REQUEST_VERSION &&
                    message_type == SOCKS_CMD_CONNECT) {
                    /* CONNECT message */
                    bool name_based = false;

                    port = get_uint16(src);
                    ipv4 = get_uint32(src);
                    if (ipv4 >= SOCKS4A_NAME_FOLLOWS_BASE &&
                        ipv4 < SOCKS4A_NAME_FOLLOWS_LIMIT) {
                        /*
                         * Addresses in this range indicate the SOCKS 4A
                         * extension to specify a hostname, which comes
                         * after the username.
                         */
                        name_based = true;
                    }
                    get_asciz(src);        /* skip username */
                    socks4_hostname = name_based ? get_asciz(src) : NULL;

                    if (get_err(src) == BSE_OUT_OF_DATA)
                        return;
                    if (get_err(src))
                        goto socks4_reject;

                    pf->port = port;
                    if (name_based) {
                        pf->hostname = dupstr(socks4_hostname);
                    } else {
                        pf->hostname = ipv4_to_string(ipv4);
                    }

                    output = strbuf_new();
                    put_byte(output, SOCKS4_REPLY_VERSION);
                    put_byte(output, SOCKS4_RESP_SUCCESS);
                    put_uint16(output, 0);     /* null port field */
                    put_uint32(output, 0);     /* null address field */
                    sk_write(pf->s, output->u, output->len);
                    strbuf_free(output);

                    pf->socks_state = SOCKS_NONE;
                    pf->socksbuf_consumed = src->pos;
                    break;
                }

              socks4_reject:
                output = strbuf_new();
                put_byte(output, SOCKS4_REPLY_VERSION);
                put_byte(output, SOCKS4_RESP_FAILURE);
                put_uint16(output, 0);     /* null port field */
                put_uint32(output, 0);     /* null address field */
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);
                pfd_close(pf);
                return;

              case SOCKS_5_INITIAL:
                /* SOCKS 5 initial method list */
                socks_version = get_byte(src);
                methods = get_pstring(src);

                method = SOCKS5_AUTH_REJECTED;

                /* Search the method list for AUTH_NONE, which is the
                 * only one this client code can speak */
                for (size_t i = 0; i < methods.len; i++) {
                    unsigned char this_method =
                        ((const unsigned char *)methods.ptr)[i];
                    if (this_method == SOCKS5_AUTH_NONE) {
                        method = this_method;
                        break;
                    }
                }

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (get_err(src))
                    method = SOCKS5_AUTH_REJECTED;

                output = strbuf_new();
                put_byte(output, SOCKS5_REPLY_VERSION);
                put_byte(output, method);
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);

                if (method == SOCKS5_AUTH_REJECTED) {
                    pfd_close(pf);
                    return;
                }

                pf->socks_state = SOCKS_5_CONNECT;
                pf->socksbuf_consumed = src->pos;
                break;

              case SOCKS_5_CONNECT:
                /* SOCKS 5 connect message */
                socks_version = get_byte(src);
                message_type = get_byte(src);
                reserved_byte = get_byte(src);

                if (socks_version == SOCKS5_REQUEST_VERSION &&
                    message_type == SOCKS_CMD_CONNECT &&
                    reserved_byte == 0) {

                    reply_code = SOCKS5_RESP_SUCCESS;

                    switch (get_byte(src)) {
                      case SOCKS5_ADDR_IPV4:
                        pf->hostname = ipv4_to_string(get_uint32(src));
                        break;
                      case SOCKS5_ADDR_IPV6:
                        pf->hostname = ipv6_to_string(get_data(src, 16));
                        break;
                      case SOCKS5_ADDR_HOSTNAME:
                        pf->hostname = mkstr(get_pstring(src));
                        break;
                      default:
                        pf->hostname = NULL;
                        reply_code = SOCKS5_RESP_ADDRTYPE_NOT_SUPPORTED;
                        break;
                    }

                    pf->port = get_uint16(src);
                } else {
                    reply_code = SOCKS5_RESP_COMMAND_NOT_SUPPORTED;
                }

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (get_err(src))
                    reply_code = SOCKS5_RESP_FAILURE;

                output = strbuf_new();
                put_byte(output, SOCKS5_REPLY_VERSION);
                put_byte(output, reply_code);
                put_byte(output, 0);       /* reserved */
                put_byte(output, SOCKS5_ADDR_IPV4); /* IPv4 address follows */
                put_uint32(output, 0);     /* bound IPv4 address (unused) */
                put_uint16(output, 0);     /* bound port number (unused) */
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);

                if (reply_code != SOCKS5_RESP_SUCCESS) {
                    pfd_close(pf);
                    return;
                }

                pf->socks_state = SOCKS_NONE;
                pf->socksbuf_consumed = src->pos;
                break;
            }
        }

        /*
         * We come here when we're ready to make an actual
         * connection.
         */

        /*
         * Freeze the socket until the SSH server confirms the
         * connection.
         */
        sk_set_frozen(pf->s, true);

        pf->c = wrap_lportfwd_open(pf->cl, pf->hostname, pf->port, pf->s,
                                   &pf->chan);
    }
    if (pf->ready)
        sshfwd_write(pf->c, data, len);
}